

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O0

void __thiscall refc<cg_other>::decrement(refc<cg_other> *this)

{
  cg_other *this_00;
  refc<cg_other> *this_local;
  
  if (*this->count == 1) {
    if (this->count != (int *)0x0) {
      operator_delete(this->count);
    }
    this_00 = this->ptr;
    if (this_00 != (cg_other *)0x0) {
      cg_other::~cg_other(this_00);
      operator_delete(this_00);
    }
  }
  else {
    *this->count = *this->count + -1;
  }
  return;
}

Assistant:

void decrement() {
        if (*count == 1) {
            delete count;
            delete ptr;
        } else {
            --*count;
        }
    }